

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O2

void forth_sqrt(Forth *ptr)

{
  uint uVar1;
  long lVar2;
  runtime_error *this;
  
  if ((ptr->dStack).top != 0) {
    uVar1 = cppforth::Forth::ForthStack<unsigned_int>::getTop(&ptr->dStack,0);
    cppforth::Forth::forth_pop(ptr,1);
    lVar2 = c_sqrt((ulong)uVar1);
    cppforth::Forth::ForthStack<unsigned_int>::push(&ptr->dStack,(uint)lVar2);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"forth_sqrt does not have parameters in Forth stack");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void forth_sqrt(cppforth::Forth* ptr){
	if (ptr->forth_depth() >= 1){
		auto value = ptr->forth_tocell(0); ptr->forth_pop(1);
		ptr->forth_push(c_sqrt(value));
	}
	else {
		throw std::runtime_error(("forth_sqrt does not have parameters in Forth stack"));
	}
}